

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O1

void Imath_3_2::jacobiEigenSolver<float>
               (Matrix44<float> *A,Vec4<float> *S,Matrix44<float> *V,float tol)

{
  long lVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  float fVar6;
  float fVar7;
  int i;
  long lVar8;
  ulong uVar9;
  float *pfVar10;
  uint uVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float local_58 [4];
  undefined1 local_48 [16];
  
  V->x[0][0] = 1.0;
  *(float *)((long)(V->x + 0) + 4) = 0.0;
  *(float *)((long)(V->x + 0) + 8) = 0.0;
  *(undefined8 *)(V->x[0] + 3) = 0;
  V->x[1][1] = 1.0;
  *(float *)((long)(V->x + 1) + 8) = 0.0;
  *(float *)((long)(V->x + 1) + 0xc) = 0.0;
  *(float *)((long)(V->x + 2) + 0) = 0.0;
  *(float *)((long)(V->x + 2) + 4) = 0.0;
  V->x[2][2] = 1.0;
  *(undefined8 *)(V->x[2] + 3) = 0;
  *(float *)((long)(V->x + 3) + 4) = 0.0;
  *(float *)((long)(V->x + 3) + 8) = 0.0;
  V->x[3][3] = 1.0;
  lVar8 = 0;
  pfVar10 = (float *)A;
  do {
    (&S->x)[lVar8] = *pfVar10;
    lVar8 = lVar8 + 1;
    pfVar10 = pfVar10 + 5;
  } while (lVar8 != 4);
  fVar15 = 0.0;
  uVar9 = 0;
  pfVar10 = (float *)A;
  do {
    if (uVar9 < 3) {
      lVar8 = 1;
      do {
        fVar18 = ABS(pfVar10[lVar8]);
        if (ABS(pfVar10[lVar8]) <= fVar15) {
          fVar18 = fVar15;
        }
        fVar15 = fVar18;
        lVar1 = uVar9 + lVar8;
        lVar8 = lVar8 + 1;
      } while (lVar1 != 3);
    }
    uVar9 = uVar9 + 1;
    pfVar10 = pfVar10 + 5;
  } while (uVar9 != 4);
  fVar15 = fVar15 * tol;
  if ((fVar15 != 0.0) || (NAN(fVar15))) {
    local_48 = ZEXT416((uint)fVar15);
    uVar11 = 0;
    do {
      local_58[0] = 0.0;
      local_58[1] = 0.0;
      local_58[2] = 0.0;
      local_58[3] = 0.0;
      fVar15 = A->x[0][1];
      fVar18 = A->x[1][1] - A->x[0][0];
      if (ABS(fVar15 + fVar15) <= ABS(fVar18) * tol) {
        A->x[0][1] = 0.0;
      }
      else {
        fVar18 = fVar18 / (fVar15 + fVar15);
        fVar13 = fVar18 * fVar18 + 1.0;
        if (fVar13 < 0.0) {
          fVar13 = sqrtf(fVar13);
        }
        else {
          fVar13 = SQRT(fVar13);
        }
        fVar13 = *(float *)(&DAT_0014b120 + (ulong)(fVar18 < 0.0) * 4) / (ABS(fVar18) + fVar13);
        fVar18 = fVar13 * fVar13 + 1.0;
        if (fVar18 < 0.0) {
          fVar18 = sqrtf(fVar18);
        }
        else {
          fVar18 = SQRT(fVar18);
        }
        fVar14 = (1.0 / fVar18) * fVar13;
        fVar15 = fVar15 * fVar13;
        local_58[1] = fVar15 + 0.0;
        local_58[0] = 0.0 - fVar15;
        A->x[0][0] = A->x[0][0] - fVar15;
        fVar16 = fVar14 / (1.0 / fVar18 + 1.0);
        A->x[1][1] = fVar15 + A->x[1][1];
        A->x[0][1] = 0.0;
        uVar4 = *(undefined8 *)(A->x[0] + 2);
        uVar5 = *(undefined8 *)(A->x[1] + 2);
        fVar15 = (float)uVar4;
        fVar18 = (float)((ulong)uVar4 >> 0x20);
        fVar13 = (float)uVar5;
        fVar17 = (float)((ulong)uVar5 >> 0x20);
        *(ulong *)(A->x[0] + 2) =
             CONCAT44(fVar18 - (fVar16 * fVar18 + fVar17) * fVar14,
                      fVar15 - (fVar16 * fVar15 + fVar13) * fVar14);
        *(ulong *)(A->x[1] + 2) =
             CONCAT44((fVar18 - fVar16 * fVar17) * fVar14 + fVar17,
                      (fVar15 - fVar16 * fVar13) * fVar14 + fVar13);
        fVar15 = V->x[1][0];
        fVar6 = V->x[0][0];
        fVar7 = V->x[0][1];
        fVar18 = V->x[2][0];
        fVar13 = V->x[3][0];
        fVar17 = V->x[1][1];
        fVar2 = V->x[2][1];
        fVar3 = V->x[3][1];
        V->x[0][0] = fVar6 - (fVar16 * fVar6 + fVar7) * fVar14;
        V->x[0][1] = (fVar6 - fVar16 * fVar7) * fVar14 + fVar7;
        *(ulong *)V->x[1] =
             CONCAT44((fVar15 - fVar16 * fVar17) * fVar14 + fVar17,
                      fVar15 - (fVar16 * fVar15 + fVar17) * fVar14);
        *(ulong *)V->x[2] =
             CONCAT44((fVar18 - fVar16 * fVar2) * fVar14 + fVar2,
                      fVar18 - (fVar16 * fVar18 + fVar2) * fVar14);
        *(ulong *)V->x[3] =
             CONCAT44((fVar13 - fVar16 * fVar3) * fVar14 + fVar3,
                      fVar13 - (fVar16 * fVar13 + fVar3) * fVar14);
      }
      fVar15 = A->x[0][2];
      fVar18 = A->x[2][2] - A->x[0][0];
      if (ABS(fVar15 + fVar15) <= ABS(fVar18) * tol) {
        A->x[0][2] = 0.0;
      }
      else {
        fVar18 = fVar18 / (fVar15 + fVar15);
        fVar13 = fVar18 * fVar18 + 1.0;
        if (fVar13 < 0.0) {
          fVar13 = sqrtf(fVar13);
        }
        else {
          fVar13 = SQRT(fVar13);
        }
        fVar13 = *(float *)(&DAT_0014b120 + (ulong)(fVar18 < 0.0) * 4) / (ABS(fVar18) + fVar13);
        fVar18 = fVar13 * fVar13 + 1.0;
        if (fVar18 < 0.0) {
          fVar18 = sqrtf(fVar18);
        }
        else {
          fVar18 = SQRT(fVar18);
        }
        fVar14 = (1.0 / fVar18) * fVar13;
        fVar15 = fVar15 * fVar13;
        local_58[0] = local_58[0] - fVar15;
        local_58[2] = fVar15 + 0.0;
        fVar13 = A->x[0][1];
        A->x[0][0] = A->x[0][0] - fVar15;
        fVar16 = fVar14 / (1.0 / fVar18 + 1.0);
        A->x[2][2] = fVar15 + A->x[2][2];
        A->x[0][2] = 0.0;
        fVar15 = A->x[1][2];
        A->x[0][1] = fVar13 - (fVar16 * fVar13 + fVar15) * fVar14;
        A->x[1][2] = (fVar13 - fVar16 * fVar15) * fVar14 + fVar15;
        fVar15 = A->x[0][3];
        fVar18 = A->x[2][3];
        A->x[0][3] = fVar15 - (fVar16 * fVar15 + fVar18) * fVar14;
        A->x[2][3] = (fVar15 - fVar16 * fVar18) * fVar14 + fVar18;
        fVar15 = V->x[1][0];
        fVar6 = V->x[0][0];
        fVar7 = V->x[0][2];
        fVar18 = V->x[2][0];
        fVar13 = V->x[3][0];
        fVar17 = V->x[1][2];
        fVar2 = V->x[2][2];
        fVar3 = V->x[3][2];
        V->x[0][0] = fVar6 - (fVar16 * fVar6 + fVar7) * fVar14;
        V->x[1][0] = fVar15 - (fVar16 * fVar15 + fVar17) * fVar14;
        V->x[2][0] = fVar18 - (fVar16 * fVar18 + fVar2) * fVar14;
        V->x[3][0] = fVar13 - (fVar16 * fVar13 + fVar3) * fVar14;
        V->x[0][2] = (fVar6 - fVar16 * fVar7) * fVar14 + fVar7;
        V->x[1][2] = (fVar15 - fVar16 * fVar17) * fVar14 + fVar17;
        V->x[2][2] = (fVar18 - fVar16 * fVar2) * fVar14 + fVar2;
        V->x[3][2] = (fVar13 - fVar16 * fVar3) * fVar14 + fVar3;
      }
      fVar15 = A->x[0][3];
      fVar18 = A->x[3][3] - A->x[0][0];
      if (ABS(fVar15 + fVar15) <= ABS(fVar18) * tol) {
        A->x[0][3] = 0.0;
      }
      else {
        fVar18 = fVar18 / (fVar15 + fVar15);
        fVar13 = fVar18 * fVar18 + 1.0;
        if (fVar13 < 0.0) {
          fVar13 = sqrtf(fVar13);
        }
        else {
          fVar13 = SQRT(fVar13);
        }
        fVar13 = *(float *)(&DAT_0014b120 + (ulong)(fVar18 < 0.0) * 4) / (ABS(fVar18) + fVar13);
        fVar18 = fVar13 * fVar13 + 1.0;
        if (fVar18 < 0.0) {
          fVar18 = sqrtf(fVar18);
        }
        else {
          fVar18 = SQRT(fVar18);
        }
        fVar14 = (1.0 / fVar18) * fVar13;
        fVar16 = fVar14 / (1.0 / fVar18 + 1.0);
        fVar15 = fVar15 * fVar13;
        local_58[0] = local_58[0] - fVar15;
        local_58[3] = fVar15 + 0.0;
        A->x[0][0] = A->x[0][0] - fVar15;
        A->x[3][3] = fVar15 + A->x[3][3];
        A->x[0][3] = 0.0;
        fVar15 = A->x[1][3];
        fVar18 = A->x[2][3];
        uVar4 = *(undefined8 *)(A->x[0] + 1);
        fVar13 = (float)uVar4;
        A->x[1][3] = (fVar13 - fVar16 * fVar15) * fVar14 + fVar15;
        fVar17 = (float)((ulong)uVar4 >> 0x20);
        *(ulong *)(A->x[0] + 1) =
             CONCAT44(fVar17 - (fVar16 * fVar17 + fVar18) * fVar14,
                      fVar13 - (fVar16 * fVar13 + fVar15) * fVar14);
        A->x[2][3] = (fVar17 - fVar16 * fVar18) * fVar14 + fVar18;
        fVar15 = V->x[1][0];
        fVar6 = V->x[0][0];
        fVar7 = V->x[0][3];
        fVar18 = V->x[2][0];
        fVar13 = V->x[3][0];
        fVar17 = V->x[1][3];
        fVar2 = V->x[2][3];
        fVar3 = V->x[3][3];
        V->x[0][0] = fVar6 - (fVar16 * fVar6 + fVar7) * fVar14;
        V->x[1][0] = fVar15 - (fVar16 * fVar15 + fVar17) * fVar14;
        V->x[0][3] = (fVar6 - fVar16 * fVar7) * fVar14 + fVar7;
        *(ulong *)(V->x[1] + 3) =
             CONCAT44(fVar18 - (fVar16 * fVar18 + fVar2) * fVar14,
                      (fVar15 - fVar16 * fVar17) * fVar14 + fVar17);
        *(ulong *)(V->x[2] + 3) =
             CONCAT44(fVar13 - (fVar16 * fVar13 + fVar3) * fVar14,
                      (fVar18 - fVar16 * fVar2) * fVar14 + fVar2);
        V->x[3][3] = (fVar13 - fVar16 * fVar3) * fVar14 + fVar3;
      }
      fVar15 = A->x[1][2];
      fVar18 = A->x[2][2] - A->x[1][1];
      if (ABS(fVar15 + fVar15) <= ABS(fVar18) * tol) {
        A->x[1][2] = 0.0;
      }
      else {
        fVar18 = fVar18 / (fVar15 + fVar15);
        fVar13 = fVar18 * fVar18 + 1.0;
        if (fVar13 < 0.0) {
          fVar13 = sqrtf(fVar13);
        }
        else {
          fVar13 = SQRT(fVar13);
        }
        fVar13 = *(float *)(&DAT_0014b120 + (ulong)(fVar18 < 0.0) * 4) / (ABS(fVar18) + fVar13);
        fVar18 = fVar13 * fVar13 + 1.0;
        if (fVar18 < 0.0) {
          fVar18 = sqrtf(fVar18);
        }
        else {
          fVar18 = SQRT(fVar18);
        }
        fVar14 = (1.0 / fVar18) * fVar13;
        fVar16 = fVar14 / (1.0 / fVar18 + 1.0);
        fVar15 = fVar15 * fVar13;
        local_58[1] = local_58[1] - fVar15;
        local_58[2] = local_58[2] + fVar15;
        A->x[1][1] = A->x[1][1] - fVar15;
        A->x[2][2] = fVar15 + A->x[2][2];
        A->x[1][2] = 0.0;
        uVar4 = *(undefined8 *)(A->x[0] + 1);
        fVar15 = (float)uVar4;
        fVar18 = (float)((ulong)uVar4 >> 0x20);
        *(ulong *)(A->x[0] + 1) =
             CONCAT44(fVar14 * (-fVar16 * fVar18 + fVar15) + fVar18,
                      -fVar14 * (fVar16 * fVar15 + fVar18) + fVar15);
        fVar15 = A->x[1][3];
        fVar18 = A->x[2][3];
        A->x[1][3] = fVar15 - (fVar16 * fVar15 + fVar18) * fVar14;
        A->x[2][3] = (fVar15 - fVar16 * fVar18) * fVar14 + fVar18;
        fVar15 = V->x[1][1];
        fVar6 = V->x[0][1];
        fVar7 = V->x[0][2];
        fVar18 = V->x[2][1];
        fVar13 = V->x[3][1];
        fVar17 = V->x[1][2];
        fVar2 = V->x[2][2];
        fVar3 = V->x[3][2];
        V->x[0][1] = fVar6 - (fVar16 * fVar6 + fVar7) * fVar14;
        V->x[0][2] = (fVar6 - fVar16 * fVar7) * fVar14 + fVar7;
        *(ulong *)(V->x[1] + 1) =
             CONCAT44((fVar15 - fVar16 * fVar17) * fVar14 + fVar17,
                      fVar15 - (fVar16 * fVar15 + fVar17) * fVar14);
        *(ulong *)(V->x[2] + 1) =
             CONCAT44((fVar18 - fVar16 * fVar2) * fVar14 + fVar2,
                      fVar18 - (fVar16 * fVar18 + fVar2) * fVar14);
        *(ulong *)(V->x[3] + 1) =
             CONCAT44((fVar13 - fVar16 * fVar3) * fVar14 + fVar3,
                      fVar13 - (fVar16 * fVar13 + fVar3) * fVar14);
      }
      fVar15 = A->x[1][3];
      fVar18 = A->x[3][3] - A->x[1][1];
      if (ABS(fVar15 + fVar15) <= ABS(fVar18) * tol) {
        A->x[1][3] = 0.0;
      }
      else {
        fVar18 = fVar18 / (fVar15 + fVar15);
        fVar13 = fVar18 * fVar18 + 1.0;
        if (fVar13 < 0.0) {
          fVar13 = sqrtf(fVar13);
        }
        else {
          fVar13 = SQRT(fVar13);
        }
        fVar13 = *(float *)(&DAT_0014b120 + (ulong)(fVar18 < 0.0) * 4) / (ABS(fVar18) + fVar13);
        fVar18 = fVar13 * fVar13 + 1.0;
        if (fVar18 < 0.0) {
          fVar18 = sqrtf(fVar18);
        }
        else {
          fVar18 = SQRT(fVar18);
        }
        fVar14 = (1.0 / fVar18) * fVar13;
        fVar16 = fVar14 / (1.0 / fVar18 + 1.0);
        fVar15 = fVar15 * fVar13;
        local_58[1] = local_58[1] - fVar15;
        local_58[3] = local_58[3] + fVar15;
        A->x[1][1] = A->x[1][1] - fVar15;
        A->x[3][3] = fVar15 + A->x[3][3];
        A->x[1][3] = 0.0;
        fVar15 = A->x[0][1];
        fVar18 = A->x[0][3];
        A->x[0][1] = fVar15 - (fVar16 * fVar15 + fVar18) * fVar14;
        A->x[0][3] = (fVar15 - fVar16 * fVar18) * fVar14 + fVar18;
        fVar15 = A->x[1][2];
        fVar18 = A->x[2][3];
        A->x[1][2] = fVar15 - (fVar16 * fVar15 + fVar18) * fVar14;
        A->x[2][3] = (fVar15 - fVar16 * fVar18) * fVar14 + fVar18;
        fVar15 = V->x[1][1];
        fVar6 = V->x[0][1];
        fVar7 = V->x[0][3];
        fVar18 = V->x[2][1];
        fVar13 = V->x[3][1];
        fVar17 = V->x[1][3];
        fVar2 = V->x[2][3];
        fVar3 = V->x[3][3];
        V->x[0][1] = fVar6 - (fVar16 * fVar6 + fVar7) * fVar14;
        V->x[1][1] = fVar15 - (fVar16 * fVar15 + fVar17) * fVar14;
        V->x[2][1] = fVar18 - (fVar16 * fVar18 + fVar2) * fVar14;
        V->x[3][1] = fVar13 - (fVar16 * fVar13 + fVar3) * fVar14;
        V->x[0][3] = (fVar6 - fVar16 * fVar7) * fVar14 + fVar7;
        V->x[1][3] = (fVar15 - fVar16 * fVar17) * fVar14 + fVar17;
        V->x[2][3] = (fVar18 - fVar16 * fVar2) * fVar14 + fVar2;
        V->x[3][3] = (fVar13 - fVar16 * fVar3) * fVar14 + fVar3;
      }
      fVar15 = A->x[2][3];
      fVar18 = A->x[3][3] - A->x[2][2];
      if (ABS(fVar15 + fVar15) <= ABS(fVar18) * tol) {
        A->x[2][3] = 0.0;
      }
      else {
        fVar18 = fVar18 / (fVar15 + fVar15);
        fVar13 = fVar18 * fVar18 + 1.0;
        if (fVar13 < 0.0) {
          fVar13 = sqrtf(fVar13);
        }
        else {
          fVar13 = SQRT(fVar13);
        }
        fVar13 = *(float *)(&DAT_0014b120 + (ulong)(fVar18 < 0.0) * 4) / (ABS(fVar18) + fVar13);
        fVar18 = fVar13 * fVar13 + 1.0;
        if (fVar18 < 0.0) {
          fVar18 = sqrtf(fVar18);
        }
        else {
          fVar18 = SQRT(fVar18);
        }
        fVar14 = (1.0 / fVar18) * fVar13;
        fVar16 = fVar14 / (1.0 / fVar18 + 1.0);
        fVar15 = fVar15 * fVar13;
        local_58[3] = local_58[3] + fVar15;
        local_58[2] = local_58[2] - fVar15;
        A->x[2][2] = A->x[2][2] - fVar15;
        A->x[3][3] = fVar15 + A->x[3][3];
        A->x[2][3] = 0.0;
        uVar4 = *(undefined8 *)(A->x[0] + 2);
        uVar5 = *(undefined8 *)(A->x[1] + 2);
        fVar13 = (float)uVar5;
        fVar17 = (float)((ulong)uVar5 >> 0x20);
        fVar15 = (float)uVar4;
        fVar18 = (float)((ulong)uVar4 >> 0x20);
        *(ulong *)(A->x[0] + 2) =
             CONCAT44((-fVar16 * fVar18 + fVar15) * fVar14 + fVar18,
                      (fVar16 * fVar15 + fVar18) * -fVar14 + fVar15);
        *(ulong *)(A->x[1] + 2) =
             CONCAT44((-fVar16 * fVar17 + fVar13) * fVar14 + fVar17,
                      (fVar16 * fVar13 + fVar17) * -fVar14 + fVar13);
        fVar15 = V->x[1][2];
        fVar6 = V->x[0][2];
        fVar7 = V->x[0][3];
        fVar18 = V->x[2][2];
        fVar13 = V->x[3][2];
        fVar17 = V->x[1][3];
        fVar2 = V->x[2][3];
        fVar3 = V->x[3][3];
        V->x[0][2] = fVar6 - (fVar16 * fVar6 + fVar7) * fVar14;
        V->x[0][3] = (fVar6 - fVar16 * fVar7) * fVar14 + fVar7;
        *(ulong *)(V->x[1] + 2) =
             CONCAT44((fVar15 - fVar16 * fVar17) * fVar14 + fVar17,
                      fVar15 - (fVar16 * fVar15 + fVar17) * fVar14);
        *(ulong *)(V->x[2] + 2) =
             CONCAT44((fVar18 - fVar16 * fVar2) * fVar14 + fVar2,
                      fVar18 - (fVar16 * fVar18 + fVar2) * fVar14);
        *(ulong *)(V->x[3] + 2) =
             CONCAT44((fVar13 - fVar16 * fVar3) * fVar14 + fVar3,
                      fVar13 - (fVar16 * fVar13 + fVar3) * fVar14);
      }
      lVar8 = 0;
      pfVar10 = (float *)A;
      do {
        fVar15 = local_58[lVar8] + (&S->x)[lVar8];
        (&S->x)[lVar8] = fVar15;
        *pfVar10 = fVar15;
        lVar8 = lVar8 + 1;
        pfVar10 = pfVar10 + 5;
      } while (lVar8 != 4);
      fVar15 = 0.0;
      uVar9 = 0;
      pfVar10 = (float *)A;
      do {
        if (uVar9 < 3) {
          lVar8 = 1;
          fVar18 = fVar15;
          do {
            fVar15 = ABS(pfVar10[lVar8]);
            if (ABS(pfVar10[lVar8]) <= fVar18) {
              fVar15 = fVar18;
            }
            lVar1 = uVar9 + lVar8;
            lVar8 = lVar8 + 1;
            fVar18 = fVar15;
          } while (lVar1 != 3);
        }
        uVar9 = uVar9 + 1;
        pfVar10 = pfVar10 + 5;
      } while (uVar9 != 4);
    } while (((float)local_48._0_4_ < fVar15) &&
            (bVar12 = uVar11 < 0x13, uVar11 = uVar11 + 1, bVar12));
  }
  return;
}

Assistant:

void
jacobiEigenSolver (Matrix44<T>& A, Vec4<T>& S, Matrix44<T>& V, const T tol)
{
    V.makeIdentity ();

    for (int i = 0; i < 4; ++i)
    {
        S[i] = A[i][i];
    }

    const int maxIter =
        20; // In case we get really unlucky, prevents infinite loops
    const T absTol =
        tol * maxOffDiagSymm (A); // Tolerance is in terms of the maximum
    if (absTol != 0)              // _off-diagonal_ entry.
    {
        int numIter = 0;
        do
        {
            ++numIter;
            Vec4<T> Z (0, 0, 0, 0);
            bool    changed = jacobiRotation<0, 1, 2, 3> (A, V, Z, tol);
            changed = jacobiRotation<0, 2, 1, 3> (A, V, Z, tol) || changed;
            changed = jacobiRotation<0, 3, 1, 2> (A, V, Z, tol) || changed;
            changed = jacobiRotation<1, 2, 0, 3> (A, V, Z, tol) || changed;
            changed = jacobiRotation<1, 3, 0, 2> (A, V, Z, tol) || changed;
            changed = jacobiRotation<2, 3, 0, 1> (A, V, Z, tol) || changed;
            for (int i = 0; i < 4; ++i)
            {
                A[i][i] = S[i] += Z[i];
            }
            if (!changed) break;
        } while (maxOffDiagSymm (A) > absTol && numIter < maxIter);
    }
}